

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

void ctemplate_htmlparser::exit_state_cdata_may_close
               (statemachine_ctx *ctx,int start,char chr,int end)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  
  pvVar1 = ctx->user;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("html != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                  ,0x27e,
                  "void ctemplate_htmlparser::exit_state_cdata_may_close(statemachine_ctx *, int, char, int)"
                 );
  }
  pcVar3 = statemachine_stop_record(ctx);
  if (*pcVar3 == '/') {
    iVar2 = strcasecmp(pcVar3 + 1,(char *)((long)pvVar1 + 0x28));
    if (((iVar2 == 0) && ((uint)(int)chr < 0x3f)) &&
       ((0x4000000100002600U >> ((ulong)(uint)(int)chr & 0x3f) & 1) != 0)) {
      *(undefined1 *)((long)pvVar1 + 0x28) = 0;
      *(undefined4 *)((long)pvVar1 + 0x24) = 0;
    }
    else {
      ctx->next_state = 0x1a;
    }
    return;
  }
  __assert_fail("cdata_close_tag[0] == \'/\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x281,
                "void ctemplate_htmlparser::exit_state_cdata_may_close(statemachine_ctx *, int, char, int)"
               );
}

Assistant:

static void exit_state_cdata_may_close(statemachine_ctx *ctx, int start,
                                       char chr, int end)
{
  htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
  const char *cdata_close_tag;
  assert(html != NULL);

  cdata_close_tag = statemachine_stop_record(ctx);
  assert(cdata_close_tag[0] == '/');

  if (strcasecmp(&cdata_close_tag[1], html->tag) == 0 &&
      (chr == '>' || html_isspace(chr))) { /* Make sure we have a delimiter */
    html->tag[0] = '\0';  /* Empty tag mimicking exit_tag_name(). */
    html->in_js = 0;  /* In case this was a script tag. */
  } else {
    /* Does not close the CDATA section. Go back to CDATA. */
    ctx->next_state = HTMLPARSER_STATE_INT_CDATA_TEXT;
  }
}